

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_a9701::SerialQueueImpl::run(SerialQueueImpl *this)

{
  bool bVar1;
  reference __x;
  int local_44;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  function<void_()> fn;
  SerialQueueImpl *this_local;
  
  do {
    std::function<void_()>::function((function<void_()> *)&lock._M_owns);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_40,&this->operationsMutex);
    while (bVar1 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
                   empty(&this->operations), bVar1) {
      std::condition_variable::wait((unique_lock *)&this->readyOperationsCondition);
    }
    __x = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::front
                    (&this->operations);
    std::function<void_()>::operator=((function<void_()> *)&lock._M_owns,__x);
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&this->operations);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    bVar1 = std::function::operator_cast_to_bool((function *)&lock._M_owns);
    if (bVar1) {
      std::function<void_()>::operator()((function<void_()> *)&lock._M_owns);
      local_44 = 0;
    }
    else {
      local_44 = 3;
    }
    std::function<void_()>::~function((function<void_()> *)&lock._M_owns);
  } while (local_44 == 0);
  return;
}

Assistant:

void run() {
    while (true) {
      // Get the next operation from the queue.
      std::function<void(void)> fn;
      {
        std::unique_lock<std::mutex> lock(operationsMutex);

        // While the queue is empty, wait for an item.
        while (operations.empty()) {
          readyOperationsCondition.wait(lock);
        }

        fn = operations.front();
        operations.pop_front();
      }

      // If we got a nil function, the queue is shutting down.
      if (!fn)
        break;
      
      // Execute the operation.
      fn();
    }
  }